

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::symbol_codec::assemble_output_buf(symbol_codec *this,bool support_arith)

{
  byte *pbVar1;
  short sVar2;
  output_symbol *poVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint num_bits;
  uint uVar7;
  undefined7 in_register_00000031;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  this->m_total_bits_written = 0;
  uVar8 = 0;
  if ((int)CONCAT71(in_register_00000031,support_arith) != 0) {
    if ((this->m_arith_output_buf).m_size == 0) {
      uVar8 = 0;
      put_bits(this,0,1);
    }
    else {
      put_bits(this,1,1);
      this->m_arith_value = 0;
      this->m_arith_length = 0xffffffff;
      lVar10 = 0;
      do {
        pbVar1 = (this->m_arith_output_buf).m_p + lVar10;
        lVar10 = lVar10 + 1;
        uVar8 = (uint)*pbVar1;
        this->m_arith_value = this->m_arith_value << 8 | uVar8;
        put_bits(this,uVar8,8);
      } while (lVar10 != 4);
      uVar8 = 4;
    }
  }
  if ((this->m_output_syms).m_size != 0) {
    uVar9 = 0;
    do {
      poVar3 = (this->m_output_syms).m_p;
      sVar2 = poVar3[uVar9].m_num_bits;
      if (sVar2 == -1) {
        uVar4 = this->m_arith_length;
        while (uVar4 < 0x1000000) {
          uVar7 = 0;
          if (uVar8 < (this->m_arith_output_buf).m_size) {
            uVar6 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            uVar7 = (uint)(this->m_arith_output_buf).m_p[uVar6];
          }
          put_bits(this,uVar7,8);
          this->m_arith_value = this->m_arith_value << 8 | uVar7;
          uVar4 = this->m_arith_length << 8;
          this->m_arith_length = uVar4;
        }
        uVar4 = this->m_arith_value;
        uVar5 = (this->m_arith_length >> 0xb) * (uint)poVar3[uVar9].m_arith_prob0;
        bVar11 = uVar5 <= uVar4;
        if (bVar11) {
          this->m_arith_value = uVar4 - uVar5;
          uVar5 = this->m_arith_length - uVar5;
        }
        this->m_arith_length = uVar5;
        if (poVar3[uVar9].m_bits != (uint)bVar11) {
          crnlib_assert("bit == sym.m_bits",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_symbol_codec.cpp"
                        ,0x5c3);
        }
      }
      else {
        if (sVar2 == -2) {
          uVar4 = -this->m_bit_count & 7;
          if (uVar4 == 0) goto LAB_00198f32;
          num_bits = 8 - uVar4;
          uVar7 = 0;
        }
        else {
          num_bits = (uint)sVar2;
          uVar7 = poVar3[uVar9].m_bits;
        }
        put_bits(this,uVar7,num_bits);
      }
LAB_00198f32:
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->m_output_syms).m_size);
  }
  put_bits(this,0,7);
  return;
}

Assistant:

void symbol_codec::assemble_output_buf(bool support_arith)
    {
        m_total_bits_written = 0;

        uint arith_buf_ofs = 0;

        if (support_arith)
        {
            if (m_arith_output_buf.size())
            {
                put_bits(1, 1);

                m_arith_length = cSymbolCodecArithMaxLen;
                m_arith_value = 0;
                for (uint i = 0; i < 4; i++)
                {
                    const uint c = m_arith_output_buf[arith_buf_ofs++];
                    m_arith_value = (m_arith_value << 8) | c;
                    put_bits(c, 8);
                }
            }
            else
            {
                put_bits(0, 1);
            }
        }

        for (uint sym_index = 0; sym_index < m_output_syms.size(); sym_index++)
        {
            const output_symbol& sym = m_output_syms[sym_index];

            if (sym.m_num_bits == output_symbol::cAlignToByteSym)
            {
                put_bits_align_to_byte();
            }
            else if (sym.m_num_bits == output_symbol::cArithSym)
            {
                if (m_arith_length < cSymbolCodecArithMinLen)
                {
                    do
                    {
                        const uint c = (arith_buf_ofs < m_arith_output_buf.size()) ? m_arith_output_buf[arith_buf_ofs++] : 0;
                        put_bits(c, 8);
                        m_arith_value = (m_arith_value << 8) | c;
                    } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
                }

                //uint x = gArithProbMulTab[sym.m_arith_prob0 >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
                uint x = sym.m_arith_prob0 * (m_arith_length >> cSymbolCodecArithProbBits);
                uint bit = (m_arith_value >= x);

                if (bit == 0)
                {
                    m_arith_length = x;
                }
                else
                {
                    m_arith_value -= x;
                    m_arith_length -= x;
                }

                CRNLIB_VERIFY(bit == sym.m_bits);
            }
            else
            {
                put_bits(sym.m_bits, sym.m_num_bits);
            }
        }

        flush_bits();
    }